

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatastream.h
# Opt level: O2

qint64 QDataStream::readQSizeType(QDataStream *s)

{
  ulong uVar1;
  long in_FS_OFFSET;
  qint64 extendedLen;
  quint32 first;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  first = 0xaaaaaaaa;
  QDataStream::operator>>(s,(int *)&first);
  uVar1 = (ulong)first;
  if (uVar1 == 0xffffffff) {
    uVar1 = 0xffffffffffffffff;
  }
  else if ((first == 0xfffffffe) && (0x15 < *(int *)(s + 0x18))) {
    extendedLen = (qint64)&DAT_aaaaaaaaaaaaaaaa;
    QDataStream::operator>>(s,&extendedLen);
    uVar1 = extendedLen;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return uVar1;
  }
  __stack_chk_fail();
}

Assistant:

qint64 QDataStream::readQSizeType(QDataStream &s)
{
    quint32 first;
    s >> first;
    if (first == NullCode)
        return -1;
    if (first < ExtendedSize || s.version() < QDataStream::Qt_6_7)
        return qint64(first);
    qint64 extendedLen;
    s >> extendedLen;
    return extendedLen;
}